

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

int Dau_DsdCheck1Step(void *p,word *pTruth,int nVarsInit,int *pVarLevels)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  int v;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong *puVar15;
  uint uVar16;
  long lVar17;
  word *pwVar18;
  ulong *puVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int SuppSize;
  word *pLimit;
  int pVarPrios [12];
  word pCofTemp [64];
  uint auStack_268 [12];
  ulong local_238 [65];
  
  iVar1 = nVarsInit + -6;
  uVar24 = 1 << ((byte)iVar1 & 0x1f);
  uVar4 = 1;
  if (6 < nVarsInit) {
    uVar4 = uVar24;
  }
  iVar5 = Dau_DsdDecompose(pTruth,nVarsInit,0,0,(char *)0x0);
  if (iVar5 == 0) {
    return -1;
  }
  if (iVar5 < 1) {
    __assert_fail("nSizeNonDec > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                  ,0x387,"int Dau_DsdCheck1Step(void *, word *, int, int *)");
  }
  uVar23 = (ulong)(uint)nVarsInit;
  if (nVarsInit < 1) {
    if (pVarLevels == (int *)0x0) {
      return -2;
    }
  }
  else {
    lVar17 = uVar23 - 1;
    auVar25._8_4_ = (int)lVar17;
    auVar25._0_8_ = lVar17;
    auVar25._12_4_ = (int)((ulong)lVar17 >> 0x20);
    uVar11 = 0;
    auVar25 = auVar25 ^ _DAT_007ee2e0;
    auVar26 = _DAT_007ee2d0;
    do {
      auVar27 = auVar26 ^ _DAT_007ee2e0;
      if ((bool)(~(auVar27._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar27._0_4_ ||
                  auVar25._4_4_ < auVar27._4_4_) & 1)) {
        auStack_268[uVar11] = (uint)uVar11;
      }
      if ((auVar27._12_4_ != auVar25._12_4_ || auVar27._8_4_ <= auVar25._8_4_) &&
          auVar27._12_4_ <= auVar25._12_4_) {
        auStack_268[uVar11 + 1] = (uint)uVar11 + 1;
      }
      uVar11 = uVar11 + 2;
      lVar17 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + 2;
      auVar26._8_8_ = lVar17 + 2;
    } while ((nVarsInit + 1U & 0xfffffffe) != uVar11);
    if ((pVarLevels != (int *)0x0) && (0 < nVarsInit)) {
      uVar11 = 0;
      do {
        iVar5 = Dau_DsdLevelVar(p,(int)uVar11);
        *(int *)((long)local_238 + uVar11 * 4) = -iVar5;
        uVar11 = uVar11 + 1;
      } while (uVar23 != uVar11);
      if (nVarsInit != 1) {
        uVar12 = 1;
        uVar11 = 0;
        do {
          uVar20 = uVar11 & 0xffffffff;
          uVar14 = uVar12;
          do {
            uVar16 = (uint)uVar14;
            if (*(int *)((long)local_238 + (long)(int)(uint)uVar20 * 4) <=
                *(int *)((long)local_238 + uVar14 * 4)) {
              uVar16 = (uint)uVar20;
            }
            uVar14 = uVar14 + 1;
            uVar20 = (ulong)uVar16;
          } while (uVar23 != uVar14);
          uVar6 = auStack_268[uVar11];
          lVar17 = (long)(int)uVar16;
          auStack_268[uVar11] = auStack_268[lVar17];
          uVar2 = *(undefined4 *)((long)local_238 + uVar11 * 4);
          *(undefined4 *)((long)local_238 + uVar11 * 4) =
               *(undefined4 *)((long)local_238 + lVar17 * 4);
          uVar11 = uVar11 + 1;
          auStack_268[lVar17] = uVar6;
          *(undefined4 *)((long)local_238 + lVar17 * 4) = uVar2;
          uVar12 = uVar12 + 1;
        } while (uVar11 != nVarsInit - 1);
      }
    }
  }
  if (nVarsInit < 1) {
    return -2;
  }
  uVar16 = uVar24;
  if ((int)uVar24 < 2) {
    uVar16 = 1;
  }
  uVar6 = 0xfffffffe;
  iVar5 = 1000000000;
  uVar11 = 0;
  do {
    uVar3 = auStack_268[uVar11];
    if ((uint)nVarsInit <= uVar3) {
      __assert_fail("pVarPrios[i] >= 0 && pVarPrios[i] < nVarsInit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x39b,"int Dau_DsdCheck1Step(void *, word *, int, int *)");
    }
    bVar10 = (byte)uVar3;
    if (uVar4 == 1) {
      local_238[0] = (s_Truths6Neg[uVar3] & *pTruth) << ((byte)(1L << (bVar10 & 0x3f)) & 0x3f) |
                     s_Truths6Neg[uVar3] & *pTruth;
    }
    else if (uVar3 < 6) {
      if (0 < (int)uVar4) {
        uVar12 = s_Truths6Neg[uVar3];
        uVar14 = 0;
        do {
          local_238[uVar14] =
               (pTruth[uVar14] & uVar12) << ((byte)(1L << (bVar10 & 0x3f)) & 0x3f) |
               pTruth[uVar14] & uVar12;
          uVar14 = uVar14 + 1;
        } while (uVar4 != uVar14);
      }
    }
    else if (0 < (int)uVar4) {
      bVar9 = (byte)(uVar3 - 6);
      uVar13 = 1 << (bVar9 & 0x1f);
      iVar22 = 2 << (bVar9 & 0x1f);
      uVar12 = 1;
      if (1 < (int)uVar13) {
        uVar12 = (ulong)uVar13;
      }
      puVar15 = local_238 + (int)uVar13;
      puVar19 = local_238;
      pwVar18 = pTruth;
      do {
        if (uVar3 - 6 != 0x1f) {
          uVar14 = 0;
          do {
            uVar20 = pwVar18[uVar14];
            puVar19[uVar14] = uVar20;
            puVar15[uVar14] = uVar20;
            uVar14 = uVar14 + 1;
          } while (uVar12 != uVar14);
        }
        pwVar18 = pwVar18 + iVar22;
        puVar15 = puVar15 + iVar22;
        puVar19 = puVar19 + iVar22;
      } while (pwVar18 < pTruth + (int)uVar4);
    }
    uVar12 = 0;
    iVar22 = 0;
    do {
      if ((uint)nVarsInit < 7) {
        if ((s_Truths6Neg[uVar12] &
            (local_238[0] >> ((byte)(1 << ((byte)uVar12 & 0x1f)) & 0x3f) ^ local_238[0])) != 0) {
LAB_0049dbeb:
          iVar22 = iVar22 + 1;
        }
      }
      else if (uVar12 < 6) {
        if (iVar1 != 0x1f) {
          uVar14 = 0;
          do {
            if (((local_238[uVar14] >> ((byte)(1 << ((byte)uVar12 & 0x1f)) & 0x3f) ^
                 local_238[uVar14]) & s_Truths6Neg[uVar12]) != 0) goto LAB_0049dbeb;
            uVar14 = uVar14 + 1;
          } while (uVar16 != uVar14);
        }
      }
      else if (iVar1 != 0x1f) {
        bVar9 = (byte)(uVar12 - 6);
        uVar13 = 1 << (bVar9 & 0x1f);
        iVar7 = 2 << (bVar9 & 0x1f);
        uVar14 = 1;
        if (1 < (int)uVar13) {
          uVar14 = (ulong)uVar13;
        }
        puVar15 = local_238 + (int)uVar13;
        puVar19 = local_238;
        do {
          if (uVar12 - 6 != 0x1f) {
            uVar20 = 0;
            do {
              if (puVar19[uVar20] != puVar15[uVar20]) goto LAB_0049dbeb;
              uVar20 = uVar20 + 1;
            } while (uVar14 != uVar20);
          }
          puVar19 = puVar19 + iVar7;
          puVar15 = puVar15 + iVar7;
        } while (puVar19 < local_238 + (int)uVar24);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar23);
    iVar7 = Dau_DsdDecompose(local_238,nVarsInit,0,0,(char *)0x0);
    if (uVar4 == 1) {
      local_238[0] = (s_Truths6[uVar3] & *pTruth) >> ((byte)(1L << (bVar10 & 0x3f)) & 0x3f) |
                     s_Truths6[uVar3] & *pTruth;
    }
    else if ((int)uVar3 < 6) {
      if (0 < (int)uVar4) {
        uVar12 = s_Truths6[uVar3];
        uVar14 = 0;
        do {
          local_238[uVar14] =
               (pTruth[uVar14] & uVar12) >> ((byte)(1L << (bVar10 & 0x3f)) & 0x3f) |
               pTruth[uVar14] & uVar12;
          uVar14 = uVar14 + 1;
        } while (uVar4 != uVar14);
      }
    }
    else if (0 < (int)uVar4) {
      bVar10 = (byte)(uVar3 - 6);
      uVar13 = 1 << (bVar10 & 0x1f);
      iVar21 = 2 << (bVar10 & 0x1f);
      uVar12 = 1;
      if (1 < (int)uVar13) {
        uVar12 = (ulong)uVar13;
      }
      puVar19 = local_238;
      pwVar18 = pTruth;
      do {
        if (uVar3 - 6 != 0x1f) {
          uVar14 = 0;
          do {
            uVar20 = pwVar18[(long)(int)uVar13 + uVar14];
            puVar19[uVar14] = uVar20;
            puVar19[(long)(int)uVar13 + uVar14] = uVar20;
            uVar14 = uVar14 + 1;
          } while (uVar12 != uVar14);
        }
        pwVar18 = pwVar18 + iVar21;
        puVar19 = puVar19 + iVar21;
      } while (pwVar18 < pTruth + (int)uVar4);
    }
    uVar12 = 0;
    iVar21 = 0;
    do {
      if ((uint)nVarsInit < 7) {
        if ((s_Truths6Neg[uVar12] &
            (local_238[0] >> ((byte)(1 << ((byte)uVar12 & 0x1f)) & 0x3f) ^ local_238[0])) != 0) {
LAB_0049de00:
          iVar21 = iVar21 + 1;
        }
      }
      else if (uVar12 < 6) {
        if (iVar1 != 0x1f) {
          uVar14 = 0;
          do {
            if (((local_238[uVar14] >> ((byte)(1 << ((byte)uVar12 & 0x1f)) & 0x3f) ^
                 local_238[uVar14]) & s_Truths6Neg[uVar12]) != 0) goto LAB_0049de00;
            uVar14 = uVar14 + 1;
          } while (uVar16 != uVar14);
        }
      }
      else if (iVar1 != 0x1f) {
        bVar10 = (byte)(uVar12 - 6);
        uVar13 = 1 << (bVar10 & 0x1f);
        iVar8 = 2 << (bVar10 & 0x1f);
        uVar14 = 1;
        if (1 < (int)uVar13) {
          uVar14 = (ulong)uVar13;
        }
        puVar15 = local_238 + (int)uVar13;
        puVar19 = local_238;
        do {
          if (uVar12 - 6 != 0x1f) {
            uVar20 = 0;
            do {
              if (puVar19[uVar20] != puVar15[uVar20]) goto LAB_0049de00;
              uVar20 = uVar20 + 1;
            } while (uVar14 != uVar20);
          }
          puVar19 = puVar19 + iVar8;
          puVar15 = puVar15 + iVar8;
        } while (puVar19 < local_238 + (int)uVar24);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar23);
    iVar8 = Dau_DsdDecompose(local_238,nVarsInit,0,0,(char *)0x0);
    if ((iVar7 == 0 && iVar8 == 0) && iVar21 + iVar22 < iVar5) {
      iVar5 = iVar21 + iVar22;
      uVar6 = uVar3;
    }
    uVar11 = uVar11 + 1;
    if (uVar11 == uVar23) {
      return uVar6;
    }
  } while( true );
}

Assistant:

int Dau_DsdCheck1Step( void * p, word * pTruth, int nVarsInit, int * pVarLevels )
{
    word pCofTemp[DAU_MAX_WORD];
    int pVarPrios[DAU_MAX_VAR];
    int nWords = Abc_TtWordNum(nVarsInit);
    int nSizeNonDec, nSizeNonDec0, nSizeNonDec1;
    int i, vBest = -2, nSumCofsBest = ABC_INFINITY, nSumCofs;
    nSizeNonDec = Dau_DsdDecompose( pTruth, nVarsInit, 0, 0, NULL );
    if ( nSizeNonDec == 0 )
        return -1;
    assert( nSizeNonDec > 0 );
    // find variable priority
    for ( i = 0; i < nVarsInit; i++ )
        pVarPrios[i] = i;
    if ( pVarLevels )
    {
        extern int Dau_DsdLevelVar( void * pMan, int iVar );
        int pVarLevels[DAU_MAX_VAR];
        for ( i = 0; i < nVarsInit; i++ )
            pVarLevels[i] = -Dau_DsdLevelVar( p, i );
//        for ( i = 0; i < nVarsInit; i++ )
//            printf( "%d ", -pVarLevels[i] );
//        printf( "\n" );
        Vec_IntSelectSortCost2( pVarPrios, nVarsInit, pVarLevels );
//        for ( i = 0; i < nVarsInit; i++ )
//            printf( "%d ", pVarPrios[i] );
//        printf( "\n\n" );
    }
    for ( i = 0; i < nVarsInit; i++ )
    {
        assert( pVarPrios[i] >= 0 && pVarPrios[i] < nVarsInit );
        // try first cofactor
        Abc_TtCofactor0p( pCofTemp, pTruth, nWords, pVarPrios[i] );
        nSumCofs = Abc_TtSupportSize( pCofTemp, nVarsInit );
        nSizeNonDec0 = Dau_DsdDecompose( pCofTemp, nVarsInit, 0, 0, NULL );
        // try second cofactor
        Abc_TtCofactor1p( pCofTemp, pTruth, nWords, pVarPrios[i] );
        nSumCofs += Abc_TtSupportSize( pCofTemp, nVarsInit );
        nSizeNonDec1 = Dau_DsdDecompose( pCofTemp, nVarsInit, 0, 0, NULL );
        // compare cofactors
        if ( nSizeNonDec0 || nSizeNonDec1 )
            continue;
        if ( nSumCofsBest > nSumCofs )
        {
            vBest = pVarPrios[i];
            nSumCofsBest = nSumCofs;
        }
    }
    return vBest;
}